

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::Array2D<pbrt::SPPMPixel>::Array2D
          (Array2D<pbrt::SPPMPixel> *this,Bounds2i *extent,allocator_type allocator)

{
  undefined8 uVar1;
  int iVar2;
  SPPMPixel *pSVar3;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  SPPMPixel *in_RDI;
  int i;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = *in_RSI;
  in_RDI->radius = (Float)(int)uVar1;
  (in_RDI->Ld).r = (Float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = in_RSI[1];
  (in_RDI->Ld).g = (Float)(int)uVar1;
  (in_RDI->Ld).b = (Float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->vp).p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_RDX;
  (in_RDI->vp).p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_RDX >> 0x20);
  iVar2 = Bounds2<int>::Area((Bounds2<int> *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  pSVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::SPPMPixel>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                      (size_t)in_RDI);
  *(SPPMPixel **)&(in_RDI->vp).p.super_Tuple3<pbrt::Point3,_float>.z = pSVar3;
  for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::construct<pbrt::SPPMPixel>
              ((polymorphic_allocator<std::byte> *)CONCAT44(iVar2,iVar4),in_RDI);
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, allocator_type allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }